

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O0

float ggml_get_f32_1d(ggml_tensor *tensor,int i)

{
  int in_ESI;
  undefined4 *in_RDI;
  float local_4;
  
  switch(*in_RDI) {
  case 0:
    fprintf(_stderr,"GGML_ASSERT: %s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/antimatter15[P]alpaca/ggml.c",0xb60,
            "false");
    abort();
  case 1:
    fprintf(_stderr,"GGML_ASSERT: %s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/antimatter15[P]alpaca/ggml.c",0xb64,
            "false");
    abort();
  case 2:
    if (*(long *)(in_RDI + 6) != 1) {
      fprintf(_stderr,"GGML_ASSERT: %s:%d: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/antimatter15[P]alpaca/ggml.c",0xb68
              ,"tensor->nb[0] == sizeof(int8_t)");
      abort();
    }
    local_4 = (float)(int)*(char *)(*(long *)(in_RDI + 0x24) + (long)in_ESI);
    break;
  case 3:
    if (*(long *)(in_RDI + 6) != 2) {
      fprintf(_stderr,"GGML_ASSERT: %s:%d: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/antimatter15[P]alpaca/ggml.c",0xb6d
              ,"tensor->nb[0] == sizeof(int16_t)");
      abort();
    }
    local_4 = (float)(int)*(short *)(*(long *)(in_RDI + 0x24) + (long)in_ESI * 2);
    break;
  case 4:
    if (*(long *)(in_RDI + 6) != 4) {
      fprintf(_stderr,"GGML_ASSERT: %s:%d: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/antimatter15[P]alpaca/ggml.c",0xb72
              ,"tensor->nb[0] == sizeof(int32_t)");
      abort();
    }
    local_4 = (float)*(int *)(*(long *)(in_RDI + 0x24) + (long)in_ESI * 4);
    break;
  case 5:
    if (*(long *)(in_RDI + 6) != 2) {
      fprintf(_stderr,"GGML_ASSERT: %s:%d: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/antimatter15[P]alpaca/ggml.c",0xb77
              ,"tensor->nb[0] == sizeof(ggml_fp16_t)");
      abort();
    }
    local_4 = ggml_lookup_fp16_to_fp32
                        (*(ggml_fp16_t *)(*(long *)(in_RDI + 0x24) + (long)in_ESI * 2));
    break;
  case 6:
    if (*(long *)(in_RDI + 6) != 4) {
      fprintf(_stderr,"GGML_ASSERT: %s:%d: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/antimatter15[P]alpaca/ggml.c",0xb7c
              ,"tensor->nb[0] == sizeof(float)");
      abort();
    }
    local_4 = *(float *)(*(long *)(in_RDI + 0x24) + (long)in_ESI * 4);
    break;
  case 7:
    fprintf(_stderr,"GGML_ASSERT: %s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/antimatter15[P]alpaca/ggml.c",0xb81,
            "false");
    abort();
  default:
    local_4 = 0.0;
  }
  return local_4;
}

Assistant:

float ggml_get_f32_1d(const struct ggml_tensor * tensor, int i) {
    switch (tensor->type) {
        case GGML_TYPE_Q4_0:
            {
                GGML_ASSERT(false);
            } break;
        case GGML_TYPE_Q4_1:
            {
                GGML_ASSERT(false);
            } break;
        case GGML_TYPE_I8:
            {
                GGML_ASSERT(tensor->nb[0] == sizeof(int8_t));
                return ((int8_t *)(tensor->data))[i];
            } break;
        case GGML_TYPE_I16:
            {
                GGML_ASSERT(tensor->nb[0] == sizeof(int16_t));
                return ((int16_t *)(tensor->data))[i];
            } break;
        case GGML_TYPE_I32:
            {
                GGML_ASSERT(tensor->nb[0] == sizeof(int32_t));
                return ((int32_t *)(tensor->data))[i];
            } break;
        case GGML_TYPE_F16:
            {
                GGML_ASSERT(tensor->nb[0] == sizeof(ggml_fp16_t));
                return GGML_FP16_TO_FP32(((ggml_fp16_t *)(tensor->data))[i]);
            } break;
        case GGML_TYPE_F32:
            {
                GGML_ASSERT(tensor->nb[0] == sizeof(float));
                return ((float *)(tensor->data))[i];
            } break;
        case GGML_TYPE_COUNT:
            {
                GGML_ASSERT(false);
            } break;
    }

    return 0.0f;
}